

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_button_text_styled(nk_context *ctx,nk_style_button *style,char *title,int len)

{
  nk_rect bounds_00;
  nk_widget_layout_states len_00;
  nk_style_button *in_RSI;
  nk_input *in_RDI;
  nk_widget_layout_states state;
  nk_rect bounds;
  nk_input *in;
  nk_panel *layout;
  nk_window *win;
  nk_input *state_00;
  nk_flags in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  nk_context *in_stack_ffffffffffffffb0;
  nk_rect *in_stack_ffffffffffffffb8;
  undefined4 local_40;
  undefined4 uVar1;
  nk_key nVar2;
  float in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  nk_bool nVar3;
  
  if ((((in_RSI == (nk_style_button *)0x0) || (in_RDI == (nk_input *)0x0)) ||
      (in_RDI[0x2e].keyboard.keys[5] == (nk_key)0x0)) ||
     (*(long *)((long)in_RDI[0x2e].keyboard.keys[5] + 0xa8) == 0)) {
    nVar3 = 0;
  }
  else {
    nVar2 = in_RDI[0x2e].keyboard.keys[5];
    local_40 = (undefined4)*(undefined8 *)((long)nVar2 + 0xa8);
    uVar1 = (undefined4)((ulong)*(undefined8 *)((long)nVar2 + 0xa8) >> 0x20);
    len_00 = nk_widget(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    if (len_00 == NK_WIDGET_INVALID) {
      nVar3 = 0;
    }
    else {
      if ((len_00 == NK_WIDGET_ROM) ||
         (state_00 = in_RDI, (*(uint *)(CONCAT44(uVar1,local_40) + 4) & 0x1000) != 0)) {
        state_00 = (nk_input *)0x0;
      }
      bounds_00.y = (float)nVar2.down;
      bounds_00.w = (float)nVar2.clicked;
      bounds_00.x = (float)uVar1;
      bounds_00.h = in_stack_ffffffffffffffd0;
      nVar3 = nk_do_button_text((nk_flags *)state_00,(nk_command_buffer *)in_stack_ffffffffffffffb0,
                                bounds_00,in_stack_ffffffffffffffa8,len_00,in_stack_ffffffffffffffa0
                                ,(nk_button_behavior)((ulong)state_00 >> 0x20),in_RSI,in_RDI,
                                (nk_user_font *)
                                CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    }
  }
  return nVar3;
}

Assistant:

NK_API nk_bool
nk_button_text_styled(struct nk_context *ctx,
const struct nk_style_button *style, const char *title, int len)
{
struct nk_window *win;
struct nk_panel *layout;
const struct nk_input *in;

struct nk_rect bounds;
enum nk_widget_layout_states state;

NK_ASSERT(ctx);
NK_ASSERT(style);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!style || !ctx || !ctx->current || !ctx->current->layout) return 0;

win = ctx->current;
layout = win->layout;
state = nk_widget(&bounds, ctx);

if (!state) return 0;
in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
return nk_do_button_text(&ctx->last_widget_state, &win->buffer, bounds,
title, len, style->text_alignment, ctx->button_behavior,
style, in, ctx->style.font);
}